

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O3

void test_write_format_mtree_sub2(int use_set,int dironly)

{
  uint uVar1;
  uint uVar2;
  long t;
  wchar_t wVar3;
  int iVar4;
  mode_t mVar5;
  mode_t mVar6;
  archive *paVar7;
  char *pcVar8;
  archive_entry *entry;
  time_t tVar9;
  ulong uVar10;
  la_int64_t lVar11;
  longlong lVar12;
  char *v1;
  ulong uVar13;
  la_ssize_t v2;
  char *pcVar14;
  long lVar15;
  archive_entry *ae;
  size_t used;
  archive_entry *local_80;
  archive *local_78;
  int local_6c;
  archive *local_68;
  size_t local_60;
  char local_58 [40];
  
  paVar7 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'¨',(uint)(paVar7 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  wVar3 = archive_write_set_format_mtree(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'©',0,"ARCHIVE_OK",(long)wVar3,"archive_write_set_format_mtree(a)",paVar7);
  local_6c = use_set;
  if (use_set != 0) {
    iVar4 = archive_write_set_format_option(paVar7,(char *)0x0,"use-set","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'«',0,"ARCHIVE_OK",(long)iVar4,
                        "archive_write_set_format_option(a, NULL, \"use-set\", \"1\")",paVar7);
  }
  if (dironly != 0) {
    iVar4 = archive_write_set_format_option(paVar7,(char *)0x0,"dironly","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'­',0,"ARCHIVE_OK",(long)iVar4,
                        "archive_write_set_format_option(a, NULL, \"dironly\", \"1\")",paVar7);
  }
  iVar4 = archive_write_open_memory(paVar7,buff,0xfff,&local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'®',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",paVar7);
  pcVar8 = "COPYING";
  lVar15 = 0x20;
  local_68 = paVar7;
  do {
    local_78 = (archive *)pcVar8;
    entry = archive_entry_new();
    local_80 = entry;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'²',(uint)(entry != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    t = *(long *)((long)&entries[0xb].mtime + lVar15);
    archive_entry_set_mtime(entry,t,0);
    tVar9 = archive_entry_mtime(entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'´',(uint)(t == tVar9),"entries2[i].mtime == archive_entry_mtime(ae)",
                     (void *)0x0);
    mVar6 = *(mode_t *)((long)&entries[0xb].mode + lVar15);
    archive_entry_set_mode(entry,mVar6);
    mVar5 = archive_entry_mode(entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'¶',(uint)(mVar6 == mVar5),"entries2[i].mode == archive_entry_mode(ae)",
                     (void *)0x0);
    uVar13 = (ulong)*(uint *)((long)&entries[0xb].uid + lVar15);
    archive_entry_set_uid(entry,uVar13);
    uVar10 = archive_entry_uid(entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'¸',(uint)(uVar10 == uVar13),"entries2[i].uid == archive_entry_uid(ae)",
                     (void *)0x0);
    uVar13 = (ulong)*(uint *)((long)&entries[0xb].gid + lVar15);
    archive_entry_set_gid(entry,uVar13);
    uVar10 = archive_entry_gid(entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'º',(uint)(uVar10 == uVar13),"entries2[i].gid == archive_entry_gid(ae)",
                     (void *)0x0);
    archive_entry_copy_pathname(entry,(char *)local_78);
    paVar7 = local_68;
    if ((mVar6 & 0xf000) == 0x4000) {
      iVar4 = archive_write_header(local_68,entry);
      v2 = (la_ssize_t)iVar4;
      wVar3 = L'¾';
      lVar12 = 0;
      pcVar8 = "ARCHIVE_OK";
      pcVar14 = "archive_write_header(a, ae)";
    }
    else {
      archive_entry_set_size(entry,8);
      paVar7 = local_68;
      iVar4 = archive_write_header(local_68,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'¾',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",paVar7);
      v2 = archive_write_data(paVar7,"Hello012",0xf);
      lVar12 = 8;
      wVar3 = L'Á';
      pcVar8 = "8";
      pcVar14 = "archive_write_data(a, \"Hello012\", 15)";
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,wVar3,lVar12,pcVar8,v2,pcVar14,paVar7);
    archive_entry_free(entry);
    pcVar8 = *(char **)((long)&entries2[0].path + lVar15);
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0x180);
  iVar4 = archive_write_close(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar4,"archive_write_close(a)",paVar7);
  iVar4 = archive_write_free(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar4,"archive_write_free(a)",(void *)0x0);
  if (local_6c != 0) {
    buff[local_60] = '\0';
    pcVar8 = strstr(buff,"\n/set ");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'Ë',(uint)(pcVar8 != (char *)0x0),"NULL != (p = strstr(buff, \"\\n/set \"))"
                     ,(void *)0x0);
    if (pcVar8 != (char *)0x0) {
      pcVar8 = pcVar8 + 1;
      pcVar14 = strchr(pcVar8,10);
      if (pcVar14 == (char *)0x0) {
        pcVar14 = "/set type=dir uid=1001 gid=1001 mode=755";
        if (dironly == 0) {
          pcVar14 = "/set type=file uid=1001 gid=1001 mode=644";
        }
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'×',pcVar14,"o",pcVar8,"p",(void *)0x0,L'\0');
      }
      else {
        *pcVar14 = '\0';
        v1 = "/set type=dir uid=1001 gid=1001 mode=755";
        if (dironly == 0) {
          v1 = "/set type=file uid=1001 gid=1001 mode=644";
        }
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'×',v1,"o",pcVar8,"p",(void *)0x0,L'\0');
        *pcVar14 = '\n';
      }
    }
  }
  paVar7 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'à',(uint)(paVar7 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar4 = archive_read_support_format_all(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'á',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_format_all(a)",paVar7)
  ;
  iVar4 = archive_read_support_filter_all(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'â',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_filter_all(a)",paVar7)
  ;
  iVar4 = archive_read_open_memory(paVar7,buff,local_60);
  local_78 = paVar7;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar4,"archive_read_open_memory(a, buff, used)",
                      paVar7);
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '.';
  local_58[1] = '/';
  local_58[2] = 0;
  pcVar8 = "COPYING";
  lVar15 = 0;
  do {
    paVar7 = local_78;
    if ((dironly == 0) || ((*(uint *)((long)&entries2[0].mode + lVar15) & 0xf000) == 0x4000)) {
      iVar4 = archive_read_next_header(local_78,&local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ë',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header(a, &ae)",
                          paVar7);
      lVar12 = *(longlong *)((long)&entries2[0].mtime + lVar15);
      tVar9 = archive_entry_mtime(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ì',lVar12,"entries2[i].mtime",tVar9,"archive_entry_mtime(ae)",
                          (void *)0x0);
      uVar1 = *(uint *)((long)&entries2[0].mode + lVar15);
      mVar6 = archive_entry_mode(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'í',(ulong)uVar1,"entries2[i].mode",(ulong)mVar6,
                          "archive_entry_mode(ae)",(void *)0x0);
      uVar2 = *(uint *)((long)&entries2[0].uid + lVar15);
      lVar11 = archive_entry_uid(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'î',(ulong)uVar2,"entries2[i].uid",lVar11,"archive_entry_uid(ae)",
                          (void *)0x0);
      uVar2 = *(uint *)((long)&entries2[0].gid + lVar15);
      lVar11 = archive_entry_gid(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ï',(ulong)uVar2,"entries2[i].gid",lVar11,"archive_entry_gid(ae)",
                          (void *)0x0);
      strcpy(local_58 + 2,pcVar8);
      pcVar8 = archive_entry_pathname(local_80);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                 ,L'ñ',local_58,"str",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      if ((uVar1 & 0xf000) != 0x4000) {
        lVar11 = archive_entry_size(local_80);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                            ,L'ó',8,"8",lVar11,"archive_entry_size(ae)",(void *)0x0);
      }
    }
    paVar7 = local_78;
    pcVar8 = *(char **)((long)&entries2[1].path + lVar15);
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0x160);
  iVar4 = archive_read_close(local_78);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'õ',0,"ARCHIVE_OK",(long)iVar4,"archive_read_close(a)",paVar7);
  iVar4 = archive_read_free(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ö',0,"ARCHIVE_OK",(long)iVar4,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_write_format_mtree_sub2(int use_set, int dironly)
{
  struct archive_entry *ae;
  struct archive* a;
  size_t used;
  int i;
  char str[32];

  /* Create a mtree format archive. */
  assert((a = archive_write_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
  if (use_set)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "use-set", "1"));
  if (dironly)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "dironly", "1"));
  assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

  /* Write entries2 */
  for (i = 0; entries2[i].path != NULL; i++) {
    assert((ae = archive_entry_new()) != NULL);
    archive_entry_set_mtime(ae, entries2[i].mtime, 0);
    assert(entries2[i].mtime == archive_entry_mtime(ae));
    archive_entry_set_mode(ae, entries2[i].mode);
    assert(entries2[i].mode == archive_entry_mode(ae));
    archive_entry_set_uid(ae, entries2[i].uid);
    assert(entries2[i].uid == archive_entry_uid(ae));
    archive_entry_set_gid(ae, entries2[i].gid);
    assert(entries2[i].gid == archive_entry_gid(ae));
    archive_entry_copy_pathname(ae, entries2[i].path);
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      archive_entry_set_size(ae, 8);
    assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualIntA(a, 8,
          archive_write_data(a, "Hello012", 15));
    archive_entry_free(ae);
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

  if (use_set) {
    const char *p;

    buff[used] = '\0';
    assert(NULL != (p = strstr(buff, "\n/set ")));
    if (p != NULL) {
      char *r;
      const char *o;
      p++;
      r = strchr(p, '\n');
      if (r != NULL)
        *r = '\0';
      if (dironly)
        o = "/set type=dir uid=1001 gid=1001 mode=755";
      else
        o = "/set type=file uid=1001 gid=1001 mode=644";
      assertEqualString(o, p);
      if (r != NULL)
        *r = '\n';
    }
  }

  /*
   * Read the data and check it.
   */
  assert((a = archive_read_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

  /* Read entries2 */
  memset(str, 0, sizeof(str));
  strcpy(str, "./");
  for (i = 0; entries2[i].path != NULL; i++) {
    if (dironly && (entries2[i].mode & AE_IFMT) != S_IFDIR)
      continue;
    assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
    assertEqualInt(entries2[i].mtime, archive_entry_mtime(ae));
    assertEqualInt(entries2[i].mode, archive_entry_mode(ae));
    assertEqualInt(entries2[i].uid, archive_entry_uid(ae));
    assertEqualInt(entries2[i].gid, archive_entry_gid(ae));
    strcpy(str + 2, entries2[i].path);
    assertEqualString(str, archive_entry_pathname(ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualInt(8, archive_entry_size(ae));
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}